

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O2

bool __thiscall cmParseCacheCoverage::LoadCoverageData(cmParseCacheCoverage *this,string *d)

{
  bool bVar1;
  Status SVar2;
  char *__s;
  uint uVar3;
  Directory dir;
  string path;
  string file;
  Directory local_f0;
  cmParseCacheCoverage *local_e8;
  string *local_e0;
  ulong local_d8;
  string local_d0;
  cmAlphaNum local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  cmAlphaNum local_60;
  
  local_e8 = this;
  cmsys::Directory::Directory(&local_f0);
  local_e0 = d;
  SVar2 = cmsys::Directory::Load(&local_f0,d,(string *)0x0);
  if (SVar2.Kind_ == Success) {
    local_d8 = cmsys::Directory::GetNumberOfFiles(&local_f0);
    uVar3 = 0;
    while( true ) {
      if (local_d8 <= uVar3) break;
      __s = cmsys::Directory::GetFile(&local_f0,(ulong)uVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,__s,(allocator<char> *)&local_60);
      bVar1 = std::operator!=(&local_80,".");
      if (bVar1) {
        bVar1 = std::operator!=(&local_80,"..");
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileIsDirectory(&local_80);
          if (!bVar1) {
            local_60.View_._M_str = (local_e0->_M_dataplus)._M_p;
            local_60.View_._M_len = local_e0->_M_string_length;
            local_b0.View_._M_len = 1;
            local_b0.View_._M_str = local_b0.Digits_;
            local_b0.Digits_[0] = '/';
            cmStrCat<std::__cxx11::string>(&local_d0,&local_60,&local_b0,&local_80);
            cmsys::SystemTools::GetFilenameLastExtension((string *)&local_60,&local_d0);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_60,".cmcov");
            std::__cxx11::string::~string((string *)&local_60);
            if (bVar1) {
              bVar1 = ReadCMCovFile(local_e8,local_d0._M_dataplus._M_p);
              if (!bVar1) {
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&local_80);
                goto LAB_0046b166;
              }
            }
            std::__cxx11::string::~string((string *)&local_d0);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_80);
      uVar3 = uVar3 + 1;
    }
    bVar1 = true;
  }
  else {
LAB_0046b166:
    bVar1 = false;
  }
  cmsys::Directory::~Directory(&local_f0);
  return bVar1;
}

Assistant:

bool cmParseCacheCoverage::LoadCoverageData(std::string const& d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (cmSystemTools::GetFilenameLastExtension(path) == ".cmcov") {
        if (!this->ReadCMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}